

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

QRhiShaderResourceBinding *
QRhiShaderResourceBinding::sampledTextures
          (QRhiShaderResourceBinding *__return_storage_ptr__,int binding,StageFlags stage,int count,
          TextureAndSampler *texSamplers)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  
  memset(__return_storage_ptr__,0xaa,0x118);
  (__return_storage_ptr__->d).binding = binding;
  (__return_storage_ptr__->d).stage.
  super_QFlagsStorageHelper<QRhiShaderResourceBinding::StageFlag,_4>.
  super_QFlagsStorage<QRhiShaderResourceBinding::StageFlag>.i =
       (Int)stage.super_QFlagsStorageHelper<QRhiShaderResourceBinding::StageFlag,_4>.
            super_QFlagsStorage<QRhiShaderResourceBinding::StageFlag>.i;
  (__return_storage_ptr__->d).type = SampledTexture;
  (__return_storage_ptr__->d).u.stex.count = count;
  if (0 < count) {
    lVar4 = 0;
    do {
      if (texSamplers == (TextureAndSampler *)0x0) {
        puVar1 = (undefined8 *)((long)&(__return_storage_ptr__->d).u + lVar4 + 8);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      else {
        puVar1 = (undefined8 *)((long)&texSamplers->tex + lVar4);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(__return_storage_ptr__->d).u + lVar4 + 8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
      }
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)count << 4 != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

QRhiShaderResourceBinding QRhiShaderResourceBinding::sampledTextures(
        int binding, StageFlags stage, int count, const TextureAndSampler *texSamplers)
{
    Q_ASSERT(count >= 1 && count <= Data::MAX_TEX_SAMPLER_ARRAY_SIZE);
    QRhiShaderResourceBinding b;
    b.d.binding = binding;
    b.d.stage = stage;
    b.d.type = SampledTexture;
    b.d.u.stex.count = count;
    for (int i = 0; i < count; ++i) {
        if (texSamplers)
            b.d.u.stex.texSamplers[i] = texSamplers[i];
        else
            b.d.u.stex.texSamplers[i] = { nullptr, nullptr };
    }
    return b;
}